

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

int nni_copyin_int(int *ip,void *v,size_t sz,int minv,int maxv,nni_type t)

{
  int iVar1;
  
  if (t == NNI_TYPE_INT32) {
    iVar1 = *v;
    if (iVar1 < minv || maxv < iVar1) {
      iVar1 = 3;
    }
    else {
      *ip = iVar1;
      iVar1 = 0;
    }
  }
  else {
    iVar1 = 0x1e;
  }
  return iVar1;
}

Assistant:

int
nni_copyin_int(
    int *ip, const void *v, size_t sz, int minv, int maxv, nni_type t)
{
	int i;
	NNI_ARG_UNUSED(sz);

	if (t != NNI_TYPE_INT32) {
		return (NNG_EBADTYPE);
	}
	i = *(int *) v;
	if (i > maxv) {
		return (NNG_EINVAL);
	}
	if (i < minv) {
		return (NNG_EINVAL);
	}
	*ip = i;
	return (0);
}